

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchChoice.c
# Opt level: O2

int Dch_ObjCheckTfi(Aig_Man_t *p,Aig_Obj_t *pObj,Aig_Obj_t *pRepr)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchChoice.c"
                  ,0x18d,"int Dch_ObjCheckTfi(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  pAVar3 = pRepr;
  if (((ulong)pRepr & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pRepr)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchChoice.c"
                  ,0x18e,"int Dch_ObjCheckTfi(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  while (pAVar2 = pAVar3, pAVar2 != (Aig_Obj_t *)0x0) {
    pAVar2->field_0x18 = pAVar2->field_0x18 | 0x10;
    pAVar3 = (Aig_Obj_t *)0x0;
    if (p->pEquivs != (Aig_Obj_t **)0x0) {
      pAVar3 = p->pEquivs[pAVar2->Id];
    }
  }
  Aig_ManIncrementTravId(p);
  iVar1 = Dch_ObjCheckTfi_rec(p,pObj);
  while (pAVar3 = pRepr, pAVar3 != (Aig_Obj_t *)0x0) {
    pAVar3->field_0x18 = pAVar3->field_0x18 & 0xef;
    pRepr = (Aig_Obj_t *)0x0;
    if (p->pEquivs != (Aig_Obj_t **)0x0) {
      pRepr = p->pEquivs[pAVar3->Id];
    }
  }
  return iVar1;
}

Assistant:

int Dch_ObjCheckTfi( Aig_Man_t * p, Aig_Obj_t * pObj, Aig_Obj_t * pRepr )
{
    Aig_Obj_t * pTemp;
    int RetValue;
    assert( !Aig_IsComplement(pObj) );
    assert( !Aig_IsComplement(pRepr) );
    // mark nodes of the choice node
    for ( pTemp = pRepr; pTemp; pTemp = Aig_ObjEquiv(p, pTemp) )
        pTemp->fMarkA = 1;
    // traverse the new node
    Aig_ManIncrementTravId( p );
    RetValue = Dch_ObjCheckTfi_rec( p, pObj );
    // unmark nodes of the choice node
    for ( pTemp = pRepr; pTemp; pTemp = Aig_ObjEquiv(p, pTemp) )
        pTemp->fMarkA = 0;
    return RetValue;
}